

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

Result_t * do_stat(Result_t *__return_storage_ptr__,char *path,fstat_t *stat_info)

{
  int iVar1;
  ILogSink *pIVar2;
  undefined1 *rhs;
  undefined8 uStack_20;
  
  if (path == (char *)0x0) {
    pIVar2 = Kumu::DefaultLogSink();
    uStack_20 = 0x5a;
  }
  else {
    if (*path == '\0') {
      pIVar2 = Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (pIVar2,"Empty string in file %s, line %d\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                 ,0x5a);
      rhs = Kumu::RESULT_NULL_STR;
      goto LAB_00111d22;
    }
    if (stat_info != (fstat_t *)0x0) {
      Kumu::Result_t::Result_t(__return_storage_ptr__,(Result_t *)Kumu::RESULT_OK);
      iVar1 = stat(path,(stat *)stat_info);
      if (iVar1 == -1) {
        Kumu::Result_t::operator=(__return_storage_ptr__,(Result_t *)Kumu::RESULT_FILEOPEN);
      }
      if ((stat_info->st_mode & 0xe000) != 0) {
        return __return_storage_ptr__;
      }
      Kumu::Result_t::operator=(__return_storage_ptr__,(Result_t *)Kumu::RESULT_FILEOPEN);
      return __return_storage_ptr__;
    }
    pIVar2 = Kumu::DefaultLogSink();
    uStack_20 = 0x5b;
  }
  Kumu::ILogSink::Error
            (pIVar2,"NULL pointer in file %s, line %d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
             ,uStack_20);
  rhs = Kumu::RESULT_PTR;
LAB_00111d22:
  Kumu::Result_t::Result_t(__return_storage_ptr__,(Result_t *)rhs);
  return __return_storage_ptr__;
}

Assistant:

static Kumu::Result_t
do_stat(const char* path, fstat_t* stat_info)
{
  KM_TEST_NULL_STR_L(path);
  KM_TEST_NULL_L(stat_info);

  Kumu::Result_t result = Kumu::RESULT_OK;

#ifdef KM_WIN32
  UINT prev = ::SetErrorMode(SEM_FAILCRITICALERRORS|SEM_NOOPENFILEERRORBOX);

  if ( _stati64(path, stat_info) == (__int64)-1 )
    result = Kumu::RESULT_FILEOPEN;

  ::SetErrorMode( prev );
#else
  if ( stat(path, stat_info) == -1L )
    result = Kumu::RESULT_FILEOPEN;

  if ( (stat_info->st_mode & (S_IFREG|S_IFLNK|S_IFDIR)) == 0 )
    result = Kumu::RESULT_FILEOPEN;
#endif

  return result;
}